

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O3

Instr * __thiscall
LowererMD::Simd128ConvertToStore
          (LowererMD *this,Opnd *dst,Opnd *src1,uint8 dataWidth,Instr *instr,byte scaleFactor)

{
  Instr *pIVar1;
  Opnd *this_00;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  OpCode opcode;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_01;
  RegOpnd *dstOpnd;
  IntConstOpnd *src2Opnd;
  Instr *pIVar6;
  Func *func;
  
  pIVar1 = instr->m_prev;
  if ((src1 == (Opnd *)0x0) || (bVar3 = IRType_IsSimd128(src1->m_type), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb16,"(src1 && src1->IsSimd128())","src1 && src1->IsSimd128()");
    if (!bVar3) goto LAB_0067702a;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(dst);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb17,"(dst->IsIndirOpnd())","dst->IsIndirOpnd()");
    if (!bVar3) goto LAB_0067702a;
    *puVar5 = 0;
  }
  if (scaleFactor != '\0') {
    this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_01);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0xb1c,"(!m_func->GetJITFunctionBody()->IsAsmJsMode())",
                         "!m_func->GetJITFunctionBody()->IsAsmJsMode()");
      if (!bVar3) goto LAB_0067702a;
      *puVar5 = 0;
    }
    OVar4 = IR::Opnd::GetKind(dst);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar3) goto LAB_0067702a;
      *puVar5 = 0;
    }
    *(byte *)((long)&dst[2]._vptr_Opnd + 4) = scaleFactor;
  }
  switch((uint)dataWidth << 0x1e | dataWidth - 4 >> 2) {
  case 0:
    func = instr->m_func;
    opcode = MOVSS;
    break;
  case 1:
    func = instr->m_func;
    opcode = MOVSD;
    break;
  case 2:
    dstOpnd = IR::RegOpnd::New(src1->m_type,instr->m_func);
    pIVar6 = IR::Instr::New(MOVAPS,&dstOpnd->super_Opnd,src1,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    pIVar6 = IR::Instr::New(MOVSD,dst,&dstOpnd->super_Opnd,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    src2Opnd = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
    pIVar6 = IR::Instr::New(PSRLDQ,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&src2Opnd->super_Opnd,
                            instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    pIVar6 = IR::Instr::New(MOVSS,dst,&dstOpnd->super_Opnd,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    this_00 = pIVar6->m_dst;
    OVar4 = IR::Opnd::GetKind(this_00);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar3) goto LAB_0067702a;
      *puVar5 = 0;
    }
    OVar4 = IR::Opnd::GetKind(dst);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar3) goto LAB_0067702a;
      *puVar5 = 0;
    }
    *(int *)&this_00[2]._vptr_Opnd = *(int *)&dst[2]._vptr_Opnd + 8;
    this_00->field_0xe = 1;
    goto LAB_0067700c;
  case 3:
    opcode = LowererMDArch::GetAssignOp(src1->m_type);
    func = instr->m_func;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb3f,"((0))","(0)");
    if (!bVar3) {
LAB_0067702a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    goto LAB_0067700c;
  }
  pIVar6 = IR::Instr::New(opcode,dst,src1,func);
  IR::Instr::InsertBefore(instr,pIVar6);
LAB_0067700c:
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
LowererMD::Simd128ConvertToStore(IR::Opnd *dst, IR::Opnd *src1, uint8 dataWidth, IR::Instr* instr, byte scaleFactor /* = 0 */)
{
    IR::Instr * instrPrev = instr->m_prev;

    Assert(src1 && src1->IsSimd128());
    Assert(dst->IsIndirOpnd());

    if (scaleFactor > 0)
    {
        // needed only for non-Asmjs code
        Assert(!m_func->GetJITFunctionBody()->IsAsmJsMode());
        dst->AsIndirOpnd()->SetScale(scaleFactor);
    }

    switch (dataWidth)
    {
    case 16:
        // MOVUPS dst([arrayBuffer + indexOpnd]), src1
        instr->InsertBefore(IR::Instr::New(LowererMDArch::GetAssignOp(src1->GetType()), dst, src1, instr->m_func));
        break;
    case 12:
    {
               IR::RegOpnd *temp = IR::RegOpnd::New(src1->GetType(), instr->m_func);
               IR::Instr *movss;
               // MOVAPS temp, src
               instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVAPS, temp, src1, instr->m_func));
               // MOVSD dst([arrayBuffer + indexOpnd]), temp
               instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSD, dst, temp, instr->m_func));
               // PSRLDQ temp, 0x08
               instr->InsertBefore(IR::Instr::New(Js::OpCode::PSRLDQ, temp, temp, IR::IntConstOpnd::New(8, TyInt8, m_func, true), instr->m_func));
               // MOVSS dst([arrayBuffer + indexOpnd + 8]), temp
               movss = IR::Instr::New(Js::OpCode::MOVSS, dst, temp, instr->m_func);
               instr->InsertBefore(movss);
               movss->GetDst()->AsIndirOpnd()->SetOffset(dst->AsIndirOpnd()->GetOffset() + 8, true);
               break;
    }
    case 8:
        // MOVSD dst([arrayBuffer + indexOpnd]), src1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSD, dst, src1, instr->m_func));
        break;
    case 4:
        // MOVSS dst([arrayBuffer + indexOpnd]), src1
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSS, dst, src1, instr->m_func));
        break;
    default:;
        Assume(UNREACHED);
    }
    instr->Remove();
    return instrPrev;
}